

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O2

void update_last(EverCrypt_Hash_state_s *s,uint64_t prev_len,uint8_t *last,uint32_t last_len)

{
  Lib_IntVector_Intrinsics_vec256 *hash;
  undefined1 totlen [16];
  undefined1 prev [16];
  undefined1 totlen_00 [16];
  undefined1 prev_00 [16];
  Spec_Hash_Definitions_hash_alg a;
  uint32_t rem;
  uint64_t *p1;
  Lib_IntVector_Intrinsics_vec128 wv [4];
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  uint64_t local_c0 [23];
  
  if (0xd < s->tag) {
    fprintf(_stderr,"KaRaMeL abort at %s:%d\n%s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_Hash.c"
            ,0x299,"unreachable (pattern matches are exhaustive in F*)");
    exit(0xff);
  }
  hash = (Lib_IntVector_Intrinsics_vec256 *)(s->field_1).case_MD5_s;
  rem = (uint32_t)prev_len;
  switch(s->tag) {
  case '\0':
    Hacl_Hash_MD5_update_last((uint32_t *)hash,prev_len,last,last_len);
    break;
  case '\x01':
    Hacl_Hash_SHA1_update_last((uint32_t *)hash,prev_len,last,last_len);
    break;
  case '\x02':
    Hacl_Hash_SHA2_sha224_update_last(last_len + prev_len,last_len,last,(uint32_t *)hash);
    break;
  case '\x03':
    Hacl_Hash_SHA2_sha256_update_last(last_len + prev_len,last_len,last,(uint32_t *)hash);
    break;
  case '\x04':
    totlen._8_8_ = in_stack_ffffffffffffff28;
    totlen._0_8_ = in_stack_ffffffffffffff20;
    Hacl_Hash_SHA2_sha384_update_last
              ((FStar_UInt128_uint128)totlen,last_len + rem,
               (uint8_t *)(ulong)CARRY8((ulong)last_len,prev_len),(uint64_t *)(ulong)last_len);
    break;
  case '\x05':
    totlen_00._8_8_ = in_stack_ffffffffffffff28;
    totlen_00._0_8_ = in_stack_ffffffffffffff20;
    Hacl_Hash_SHA2_sha512_update_last
              ((FStar_UInt128_uint128)totlen_00,last_len + rem,
               (uint8_t *)(ulong)CARRY8((ulong)last_len,prev_len),(uint64_t *)(ulong)last_len);
    break;
  case '\x06':
    a = '\t';
    goto LAB_0015f5a1;
  case '\a':
    a = '\b';
    goto LAB_0015f5a1;
  case '\b':
    a = '\n';
    goto LAB_0015f5a1;
  case '\t':
    a = '\v';
LAB_0015f5a1:
    Hacl_Hash_SHA3_update_last_sha3(a,(uint64_t *)hash,last,last_len);
    break;
  case '\n':
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    Hacl_Hash_Blake2s_update_last
              (last_len,(uint32_t *)local_c0,(uint32_t *)hash,prev_len,last_len,last);
    break;
  case '\v':
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    Hacl_Hash_Blake2s_Simd128_update_last
              (last_len,(Lib_IntVector_Intrinsics_vec128 *)local_c0,
               (Lib_IntVector_Intrinsics_vec128 *)hash,prev_len,last_len,last);
    break;
  case '\f':
    local_c0[0xe] = 0;
    local_c0[0xf] = 0;
    local_c0[0xc] = 0;
    local_c0[0xd] = 0;
    local_c0[10] = 0;
    local_c0[0xb] = 0;
    local_c0[8] = 0;
    local_c0[9] = 0;
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    prev._8_8_ = in_stack_ffffffffffffff28;
    prev._0_8_ = last;
    Hacl_Hash_Blake2b_update_last
              (last_len,local_c0,(uint64_t *)hash,(FStar_UInt128_uint128)prev,rem,(uint8_t *)0x0);
    break;
  case '\r':
    local_c0[0xe] = 0;
    local_c0[0xf] = 0;
    local_c0[0xc] = 0;
    local_c0[0xd] = 0;
    local_c0[10] = 0;
    local_c0[0xb] = 0;
    local_c0[8] = 0;
    local_c0[9] = 0;
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    prev_00._8_8_ = in_stack_ffffffffffffff28;
    prev_00._0_8_ = last;
    Hacl_Hash_Blake2b_Simd256_update_last
              (last_len,(Lib_IntVector_Intrinsics_vec256 *)local_c0,hash,
               (FStar_UInt128_uint128)prev_00,rem,(uint8_t *)0x0);
  }
  return;
}

Assistant:

static void
update_last(EverCrypt_Hash_state_s *s, uint64_t prev_len, uint8_t *last, uint32_t last_len)
{
  EverCrypt_Hash_state_s scrut = *s;
  if (scrut.tag == MD5_s)
  {
    uint32_t *p1 = scrut.case_MD5_s;
    Hacl_Hash_MD5_update_last(p1, prev_len, last, last_len);
    return;
  }
  if (scrut.tag == SHA1_s)
  {
    uint32_t *p1 = scrut.case_SHA1_s;
    Hacl_Hash_SHA1_update_last(p1, prev_len, last, last_len);
    return;
  }
  if (scrut.tag == SHA2_224_s)
  {
    uint32_t *p1 = scrut.case_SHA2_224_s;
    Hacl_Hash_SHA2_sha224_update_last(prev_len + (uint64_t)last_len, last_len, last, p1);
    return;
  }
  if (scrut.tag == SHA2_256_s)
  {
    uint32_t *p1 = scrut.case_SHA2_256_s;
    Hacl_Hash_SHA2_sha256_update_last(prev_len + (uint64_t)last_len, last_len, last, p1);
    return;
  }
  if (scrut.tag == SHA2_384_s)
  {
    uint64_t *p1 = scrut.case_SHA2_384_s;
    Hacl_Hash_SHA2_sha384_update_last(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128(prev_len),
        FStar_UInt128_uint64_to_uint128((uint64_t)last_len)),
      last_len,
      last,
      p1);
    return;
  }
  if (scrut.tag == SHA2_512_s)
  {
    uint64_t *p1 = scrut.case_SHA2_512_s;
    Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128(prev_len),
        FStar_UInt128_uint64_to_uint128((uint64_t)last_len)),
      last_len,
      last,
      p1);
    return;
  }
  if (scrut.tag == SHA3_224_s)
  {
    uint64_t *p1 = scrut.case_SHA3_224_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_224, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_256_s)
  {
    uint64_t *p1 = scrut.case_SHA3_256_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_256, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_384_s)
  {
    uint64_t *p1 = scrut.case_SHA3_384_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_384, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_512_s)
  {
    uint64_t *p1 = scrut.case_SHA3_512_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_512, p1, last, last_len);
    return;
  }
  if (scrut.tag == Blake2S_s)
  {
    uint32_t *p1 = scrut.case_Blake2S_s;
    uint32_t wv[16U] = { 0U };
    Hacl_Hash_Blake2s_update_last(last_len, wv, p1, prev_len, last_len, last);
    return;
  }
  if (scrut.tag == Blake2S_128_s)
  {
    Lib_IntVector_Intrinsics_vec128 *p1 = scrut.case_Blake2S_128_s;
    #if HACL_CAN_COMPILE_VEC128
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 wv[4U] KRML_POST_ALIGN(16) = { 0U };
    Hacl_Hash_Blake2s_Simd128_update_last(last_len, wv, p1, prev_len, last_len, last);
    return;
    #else
    KRML_MAYBE_UNUSED_VAR(p1);
    return;
    #endif
  }
  if (scrut.tag == Blake2B_s)
  {
    uint64_t *p1 = scrut.case_Blake2B_s;
    uint64_t wv[16U] = { 0U };
    Hacl_Hash_Blake2b_update_last(last_len,
      wv,
      p1,
      FStar_UInt128_uint64_to_uint128(prev_len),
      last_len,
      last);
    return;
  }
  if (scrut.tag == Blake2B_256_s)
  {
    Lib_IntVector_Intrinsics_vec256 *p1 = scrut.case_Blake2B_256_s;
    #if HACL_CAN_COMPILE_VEC256
    KRML_PRE_ALIGN(32) Lib_IntVector_Intrinsics_vec256 wv[4U] KRML_POST_ALIGN(32) = { 0U };
    Hacl_Hash_Blake2b_Simd256_update_last(last_len,
      wv,
      p1,
      FStar_UInt128_uint64_to_uint128(prev_len),
      last_len,
      last);
    return;
    #else
    KRML_MAYBE_UNUSED_VAR(p1);
    return;
    #endif
  }
  KRML_HOST_EPRINTF("KaRaMeL abort at %s:%d\n%s\n",
    __FILE__,
    __LINE__,
    "unreachable (pattern matches are exhaustive in F*)");
  KRML_HOST_EXIT(255U);
}